

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O2

int bufs_alloc_chain(nghttp2_bufs *bufs)

{
  uint8_t **ppuVar1;
  nghttp2_buf_chain *pnVar2;
  size_t sVar3;
  int iVar4;
  nghttp2_buf_chain *chain;
  nghttp2_buf_chain *local_10;
  
  pnVar2 = bufs->cur->next;
  if (pnVar2 == (nghttp2_buf_chain *)0x0) {
    if (bufs->max_chunk == bufs->chunk_used) {
      return -0x1f6;
    }
    iVar4 = buf_chain_new(&local_10,bufs->chunk_length,bufs->mem);
    if (iVar4 != 0) {
      return iVar4;
    }
    bufs->chunk_used = bufs->chunk_used + 1;
    bufs->cur->next = local_10;
    bufs->cur = local_10;
    sVar3 = bufs->offset;
    ppuVar1 = &(local_10->buf).pos;
    *ppuVar1 = *ppuVar1 + sVar3;
    ppuVar1 = &(local_10->buf).last;
    *ppuVar1 = *ppuVar1 + sVar3;
  }
  else {
    bufs->cur = pnVar2;
  }
  return 0;
}

Assistant:

static int bufs_alloc_chain(nghttp2_bufs *bufs) {
  int rv;
  nghttp2_buf_chain *chain;

  if (bufs->cur->next) {
    bufs->cur = bufs->cur->next;

    return 0;
  }

  if (bufs->max_chunk == bufs->chunk_used) {
    return NGHTTP2_ERR_BUFFER_ERROR;
  }

  rv = buf_chain_new(&chain, bufs->chunk_length, bufs->mem);
  if (rv != 0) {
    return rv;
  }

  DEBUGF("new buffer %zu bytes allocated for bufs %p, used %zu\n",
         bufs->chunk_length, bufs, bufs->chunk_used);

  ++bufs->chunk_used;

  bufs->cur->next = chain;
  bufs->cur = chain;

  nghttp2_buf_shift_right(&bufs->cur->buf, bufs->offset);

  return 0;
}